

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O2

bool __thiscall merlin::variable_set::operator==(variable_set *this,variable_set *B)

{
  unsigned_long *__first1;
  unsigned_long *puVar1;
  unsigned_long *__first2;
  int iVar2;
  ulong uVar3;
  
  __first1 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  puVar1 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = (long)puVar1 - (long)__first1;
  __first2 = (B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar3 != (long)(B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
    return false;
  }
  if ((long)puVar1 - (long)__first1 != 0) {
    iVar2 = std::__memcmp<unsigned_long,unsigned_long>
                      (__first1,__first2,(long)puVar1 - (long)__first1 >> 3);
    uVar3 = (ulong)(iVar2 == 0);
  }
  return (bool)(puVar1 == __first1 | (byte)uVar3 & 1);
}

Assistant:

bool operator==(const variable_set& B) const {
		return (size() == B.size())
				&& std::equal(m_v.begin(), m_v.end(), B.m_v.begin());
	}